

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

bool __thiscall PhyloTree::equals(PhyloTree *this,PhyloTree *t)

{
  bool bVar1;
  bool bVar2;
  undefined6 in_stack_ffffffffffffff60;
  bool bVar3;
  undefined1 uVar4;
  byte bVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  byte bVar6;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffa4;
  
  bVar2 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = false;
  uVar7 = in_stack_ffffffffffffffa0 & 0xffffff;
  bVar6 = 0;
  bVar5 = 0;
  bVar3 = false;
  if (bVar2) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               (CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) & 0xffffffff00ffffff),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98);
    bVar1 = true;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffffa4,uVar7),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98);
    uVar7 = CONCAT13(1,(int3)uVar7);
    bVar2 = Tools::vector_equal<double>
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT17(bVar6,in_stack_ffffffffffffff80),
                       (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff78);
    bVar3 = false;
    if (bVar2) {
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,uVar7),in_stack_ffffffffffffff98);
      bVar6 = 1;
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,uVar7),in_stack_ffffffffffffff98);
      bVar5 = 1;
      bVar3 = Tools::vector_equal<PhyloTreeEdge>
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                         CONCAT17(bVar6,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    }
  }
  uVar4 = bVar3;
  if ((bVar5 & 1) != 0) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
               CONCAT17(bVar5,CONCAT16(bVar3,in_stack_ffffffffffffff60)));
  }
  if ((bVar6 & 1) != 0) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
               CONCAT17(bVar5,CONCAT16(uVar4,in_stack_ffffffffffffff60)));
  }
  if ((uVar7 & 0x1000000) != 0) {
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(bVar5,CONCAT16(uVar4,in_stack_ffffffffffffff60)));
  }
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(bVar5,CONCAT16(uVar4,in_stack_ffffffffffffff60)));
  }
  return bVar3;
}

Assistant:

bool PhyloTree::equals(const PhyloTree& t) {
    return (leaf2NumMap == t.leaf2NumMap) && Tools::vector_equal(leafEdgeLengths, t.leafEdgeLengths) && Tools::vector_equal(edges, t.edges);
}